

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt_PackBegin(stbtt_pack_context *spc,uchar *pixels,int pw,int ph,int stride_in_bytes,
                   int padding,void *alloc_context)

{
  stbrp_context *con;
  stbrp_node *nodes_00;
  int local_4c;
  stbrp_node *nodes;
  int num_nodes;
  stbrp_context *context;
  int padding_local;
  int stride_in_bytes_local;
  int ph_local;
  int pw_local;
  uchar *pixels_local;
  stbtt_pack_context *spc_local;
  
  con = (stbrp_context *)malloc(0x14);
  nodes_00 = (stbrp_node *)malloc((long)(pw - padding));
  if ((con == (stbrp_context *)0x0) || (nodes_00 == (stbrp_node *)0x0)) {
    if (con != (stbrp_context *)0x0) {
      free(con);
    }
    if (nodes_00 != (stbrp_node *)0x0) {
      free(nodes_00);
    }
    spc_local._4_4_ = 0;
  }
  else {
    spc->user_allocator_context = alloc_context;
    spc->width = pw;
    spc->height = ph;
    spc->pixels = pixels;
    spc->pack_info = con;
    spc->nodes = nodes_00;
    spc->padding = padding;
    local_4c = pw;
    if (stride_in_bytes != 0) {
      local_4c = stride_in_bytes;
    }
    spc->stride_in_bytes = local_4c;
    spc->h_oversample = 1;
    spc->v_oversample = 1;
    stbrp_init_target(con,pw - padding,ph - padding,nodes_00,pw - padding);
    if (pixels != (uchar *)0x0) {
      memset(pixels,0,(long)(pw * ph));
    }
    spc_local._4_4_ = 1;
  }
  return spc_local._4_4_;
}

Assistant:

STBTT_DEF int stbtt_PackBegin(stbtt_pack_context *spc, unsigned char *pixels, int pw, int ph, int stride_in_bytes, int padding, void *alloc_context)
{
   stbrp_context *context = (stbrp_context *) STBTT_malloc(sizeof(*context)            ,alloc_context);
   int            num_nodes = pw - padding;
   stbrp_node    *nodes   = (stbrp_node    *) STBTT_malloc(sizeof(*nodes  ) * num_nodes,alloc_context);

   if (context == NULL || nodes == NULL) {
      if (context != NULL) STBTT_free(context, alloc_context);
      if (nodes   != NULL) STBTT_free(nodes  , alloc_context);
      return 0;
   }

   spc->user_allocator_context = alloc_context;
   spc->width = pw;
   spc->height = ph;
   spc->pixels = pixels;
   spc->pack_info = context;
   spc->nodes = nodes;
   spc->padding = padding;
   spc->stride_in_bytes = stride_in_bytes != 0 ? stride_in_bytes : pw;
   spc->h_oversample = 1;
   spc->v_oversample = 1;

   stbrp_init_target(context, pw-padding, ph-padding, nodes, num_nodes);

   if (pixels)
      STBTT_memset(pixels, 0, pw*ph); // background of 0 around pixels

   return 1;
}